

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1>::
     spinlocking_heterogeneous_queue_reentrant_put_transaction_samples(void)

{
  bool bVar1;
  int *piVar2;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *psVar3;
  ostream *poVar4;
  runtime_type<> *prVar5;
  type_info *ptVar6;
  char *pcVar7;
  double *pdVar8;
  reentrant_put_transaction<double> typed_put;
  reentrant_put_transaction<void> untyped_put;
  int value_2;
  SpQueue queue_15;
  SpQueue queue_14;
  reentrant_put_transaction<void> put_3;
  int value_1;
  SpQueue queue_13;
  reentrant_put_transaction<int> put_1;
  reentrant_put_transaction<void> put_2;
  int value;
  SpQueue queue_12;
  reentrant_put_transaction<int> put;
  SpQueue queue_11;
  reentrant_put_transaction<void> transaction_3;
  SpQueue queue_10;
  reentrant_put_transaction<void> transaction_2;
  SpQueue queue_9;
  reentrant_put_transaction<void> transaction_1;
  SpQueue queue_8;
  anon_class_8_1_a8890831 post_message_5;
  SpQueue queue_7;
  anon_class_8_1_a8890831 post_message_4;
  SpQueue queue_6;
  int msg_2_1;
  int msg_1_1;
  anon_class_16_2_e5d92710 consume_all_msgs_1;
  time_point start_time_1;
  anon_class_8_1_a8890831 post_message_3;
  SpQueue queue_5;
  anon_class_8_1_a8890831 post_message_2;
  SpQueue queue_4;
  anon_class_8_1_a8890831 post_message_1;
  SpQueue queue_3;
  int msg_2;
  int msg_1;
  anon_class_16_2_e5d92710 consume_all_msgs;
  time_point start_time;
  anon_class_8_1_a8890831 post_message;
  SpQueue queue_2;
  reentrant_put_transaction<void> transaction2_1;
  reentrant_put_transaction<int> transaction1_1;
  SpQueue queue_1;
  type transaction2;
  reentrant_put_transaction<int> transaction1;
  SpQueue queue;
  reentrant_put_transaction<void> transaction;
  bool local_fd1;
  double local_f98;
  reentrant_put_transaction<double> local_f90;
  reentrant_put_transaction<double> local_f70;
  runtime_type local_f50;
  reentrant_put_transaction<void> local_f48;
  reentrant_put_transaction<void> local_f28;
  undefined4 local_f04;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_f00;
  int local_e64;
  reentrant_put_transaction<int> local_e60;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_e40;
  runtime_type local_d90;
  reentrant_put_transaction<void> local_d88;
  reentrant_put_transaction<void> local_d68;
  undefined4 local_d44;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_d40;
  int local_c94;
  reentrant_put_transaction<int> local_c90;
  reentrant_put_transaction<int> local_c70;
  runtime_type local_c50;
  reentrant_put_transaction<void> local_c48;
  reentrant_put_transaction<void> local_c28;
  undefined4 local_c04;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_c00;
  reentrant_consume_operation local_b48;
  int local_b2c;
  reentrant_put_transaction<int> local_b28;
  int local_b04;
  reentrant_put_transaction<int> local_b00;
  reentrant_put_transaction<int> local_ae0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_ac0;
  int local_a04;
  reentrant_put_transaction<int> local_a00;
  reentrant_put_transaction<void> local_9e0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_9c0;
  int local_904;
  reentrant_put_transaction<int> local_900;
  reentrant_put_transaction<void> local_8e0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_8c0;
  int local_804;
  reentrant_put_transaction<int> local_800;
  reentrant_put_transaction<void> local_7e0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_7c0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_708;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_700;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_648;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_640;
  undefined4 local_5a8;
  undefined4 local_5a4;
  anon_class_16_2_e5d92710 local_5a0;
  time_point local_590;
  anon_class_8_1_a8890831 local_588;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_580;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_4c8;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_4c0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_408;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_400;
  undefined4 local_368;
  undefined4 local_364;
  anon_class_16_2_e5d92710 local_360;
  time_point local_350;
  anon_class_8_1_a8890831 local_348;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_340;
  int local_28c;
  reentrant_put_transaction<int> local_288;
  reentrant_put_transaction<void> local_268;
  int local_244;
  reentrant_put_transaction<int> local_240;
  reentrant_put_transaction<int> local_220;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_200;
  reentrant_put_transaction<int> local_178;
  int local_144;
  reentrant_put_transaction<int> local_140;
  reentrant_put_transaction<int> local_120;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_100;
  reentrant_put_transaction<void> local_70 [3];
  
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction(local_70);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<void>::empty(local_70);
  if (!bVar1) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x4c5,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(local_70);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_100);
  local_144 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_140,&local_100,&local_144);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&local_120,&local_140);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_140);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&local_178,&local_120);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<int>::empty(&local_120);
  if (!bVar1) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x4f3,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  piVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<int>::element<int,_nullptr>(&local_178);
  if (*piVar2 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x4f4,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::commit(&local_178);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<int>::empty(&local_178);
  if (!bVar1) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x4f8,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_178);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_120);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_100);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_200);
  local_244 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_240,&local_200,&local_244);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&local_220,&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction(&local_268);
  local_28c = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_288,&local_200,&local_28c);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_268,&local_288);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_288);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_268,&local_220);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::commit(&local_268);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<void>::empty(&local_268);
  if (!bVar1) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x52b,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_268);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_220);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_340);
  local_348.queue = &local_340;
  local_350.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_360.start_time = &local_350;
  local_364 = 0x2a;
  local_368 = 0x237;
  local_360.queue = &local_340;
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()(&local_348,&local_364,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()(&local_348,&local_368,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_16_2_e5d92710::
  operator()(&local_360);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_340);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_400);
  local_408 = &local_400;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_400);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_4c0);
  local_4c8 = &local_4c0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_4c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_580);
  local_588.queue = &local_580;
  local_590.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_5a0.start_time = &local_590;
  local_5a4 = 0x2a;
  local_5a8 = 0x237;
  local_5a0.queue = &local_580;
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()(&local_588,&local_5a4,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::
  operator()(&local_588,&local_5a8,4);
  spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::anon_class_16_2_e5d92710::
  operator()(&local_5a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_580);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_640);
  local_648 = &local_640;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_640);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_700);
  local_708 = &local_700;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_700);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_7c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction(&local_7e0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<void>::empty(&local_7e0);
  if (!bVar1) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x61a,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_804 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_800,&local_7c0,&local_804);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_7e0,&local_800);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_800);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<void>::empty(&local_7e0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x61d,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_7e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_7c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_8c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction(&local_8e0);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_8e0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x628,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_904 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_900,&local_8c0,&local_904);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_8e0,&local_900);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_900);
  bVar1 = density::sp_heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)&local_8e0);
  if (!bVar1) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x62b,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_8e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_8c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_9c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction(&local_9e0);
  psVar3 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<void>::queue(&local_9e0);
  if (psVar3 != (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                 *)0x0) {
    __assert_fail("transaction.queue() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x636,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_a04 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_a00,&local_9c0,&local_a04);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)&local_9e0,&local_a00);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_a00);
  psVar3 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<void>::queue(&local_9e0);
  if (psVar3 != &local_9c0) {
    __assert_fail("transaction.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x639,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_9e0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_9c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_ac0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_ac0);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x644,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_b04 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_b00,&local_ac0,&local_b04);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&local_ae0,&local_b00);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b00);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::reentrant_put_transaction<int>::empty(&local_ae0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x648,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::cancel(&local_ae0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_ac0);
  local_fd1 = false;
  if (bVar1) {
    local_fd1 = density::
                sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                ::reentrant_put_transaction<int>::empty(&local_ae0);
  }
  if (local_fd1 == false) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x64a,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_b2c = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_b28,&local_ac0,&local_b2c);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<int>::operator=
            ((reentrant_put_transaction<int> *)&local_ae0,&local_b28);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_b28);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::commit(&local_ae0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_reentrant_consume(&local_b48,&local_ac0);
  piVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_consume_operation::element<int>(&local_b48);
  if (*piVar2 != 0x2a) {
    __assert_fail("queue.try_start_reentrant_consume().template element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x64f,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_b48);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_ae0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_ac0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_c00);
  local_c04 = 0x2a;
  local_c50.m_feature_table = (tuple_type *)density::runtime_type<>::make<int>();
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_dyn_push_copy(&local_c48,&local_c00,&local_c50,&local_c04);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_c28,&local_c48);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_c48);
  piVar2 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::reentrant_put_transaction<void>::element_ptr(&local_c28);
  if (*piVar2 != 0x2a) {
    __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x65c,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar5 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<void>::complete_type(&local_c28);
  ptVar6 = density::runtime_type<>::type_info(prVar5);
  pcVar7 = std::type_info::name(ptVar6);
  poVar4 = std::operator<<(poVar4,pcVar7);
  poVar4 = std::operator<<(poVar4,"...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::commit(&local_c28);
  local_c94 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_c90,&local_c00,&local_c94);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&local_c70,&local_c90);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_c90);
  piVar2 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::reentrant_put_transaction<int>::element_ptr(&local_c70);
  if (*piVar2 != 1) {
    __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x663,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  piVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<int>::element<int,_nullptr>(&local_c70);
  if (*piVar2 != 1) {
    __assert_fail("put_1.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x664,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::commit(&local_c70);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_c70);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_c28);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_c00);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_d40);
  local_d44 = 0x2a;
  local_d90.m_feature_table = (tuple_type *)density::runtime_type<>::make<int>();
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_dyn_push_copy(&local_d88,&local_d40,&local_d90,&local_d44);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_d68,&local_d88);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_d88);
  prVar5 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<void>::complete_type(&local_d68);
  bVar1 = density::runtime_type<>::is<int>(prVar5);
  if (!bVar1) {
    __assert_fail("put.complete_type().template is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x672,
                  "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar5 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<void>::complete_type(&local_d68);
  ptVar6 = density::runtime_type<>::type_info(prVar5);
  pcVar7 = std::type_info::name(ptVar6);
  poVar4 = std::operator<<(poVar4,pcVar7);
  poVar4 = std::operator<<(poVar4,"...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_d68);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_d40);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_e40);
  local_e64 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<int>(&local_e60,&local_e40,&local_e64);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<int>::~reentrant_put_transaction(&local_e60);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_e40);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_f00);
  local_f04 = 0x2a;
  local_f50.m_feature_table = (tuple_type *)density::runtime_type<>::make<int>();
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_dyn_push_copy(&local_f48,&local_f00,&local_f50,&local_f04);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_f28,&local_f48);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f48);
  local_f98 = 42.0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<double>(&local_f90,&local_f00,&local_f98);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<double>::reentrant_put_transaction<double,void>
            ((reentrant_put_transaction<double> *)&local_f70,&local_f90);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<double>::~reentrant_put_transaction(&local_f90);
  pdVar8 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<double>::element<double,_nullptr>(&local_f70);
  if ((*pdVar8 == 42.0) && (!NAN(*pdVar8))) {
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<double>::~reentrant_put_transaction(&local_f70);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_f28);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue(&local_f00);
    return;
  }
  __assert_fail("typed_put.element() == 42.",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                ,0x690,
                "static void density_tests::SpQueueSamples<density::concurrency_multiple, density::concurrency_multiple>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_multiple, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()
{
    using namespace density;

    {
        //! [sp_heter_queue reentrant_put_transaction default_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(transaction.empty());
        //! [sp_heter_queue reentrant_put_transaction default_construct example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction copy_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        using SpQueueInt =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_constructible<
            typename SpQueue::template reentrant_put_transaction<>>::value,
          "");
        static_assert(
          !std::is_copy_constructible<
            typename SpQueueInt::template reentrant_put_transaction<>>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction copy_construct example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction copy_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        using SpQueueInt =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_assignable<typename SpQueue::template reentrant_put_transaction<>>::value,
          "");
        static_assert(
          !std::is_copy_assignable<
            typename SpQueueInt::template reentrant_put_transaction<>>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction copy_assign example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction move_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        auto    transaction1 = queue.start_reentrant_push(1);

        // move from transaction1 to transaction2
        auto transaction2(std::move(transaction1));
        assert(transaction1.empty());
        assert(transaction2.element() == 1);

        // commit transaction2
        transaction2.commit();
        assert(transaction2.empty());

        //! [sp_heter_queue reentrant_put_transaction move_construct example 1]

        //! [sp_heter_queue reentrant_put_transaction move_construct example 2]

        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        // reentrant_put_transaction<void> can be move constructed from any reentrant_put_transaction<T>
        static_assert(
          std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");

        // reentrant_put_transaction<T> can be move constructed only from reentrant_put_transaction<T>
        static_assert(
          !std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction move_construct example 2]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction move_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        auto    transaction1 = queue.start_reentrant_push(1);

        typename SpQueue::template reentrant_put_transaction<> transaction2;
        transaction2 = queue.start_reentrant_push(1);
        transaction2 = std::move(transaction1);
        transaction2.commit();
        assert(transaction2.empty());
        //! [sp_heter_queue reentrant_put_transaction move_assign example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction move_assign example 2]
        // reentrant_put_transaction<void> can be move assigned from any reentrant_put_transaction<T>
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<void>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");

        // reentrant_put_transaction<T> can be move assigned only from reentrant_put_transaction<T>
        static_assert(
          !std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template reentrant_put_transaction<int>,
            typename SpQueue::template reentrant_put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue reentrant_put_transaction move_assign example 2]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            auto transaction             = queue.template start_reentrant_emplace<Msg>();
            transaction.element().m_len  = i_len;
            transaction.element().m_data = transaction.raw_allocate(i_len, 1);
            memcpy(transaction.element().m_data, i_data, i_len);

            assert(
              !transaction
                 .empty()); // a put transaction is not empty if it's bound to an element being put
            transaction.commit();
            assert(transaction.empty()); // the commit makes the transaction empty
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_reentrant_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue reentrant_put_transaction raw_allocate example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction              = queue.template start_reentrant_emplace<Msg>();
            transaction.element().m_len   = i_len;
            transaction.element().m_chars = transaction.raw_allocate_copy(i_data, i_data + i_len);
            memcpy(transaction.element().m_chars, i_data, i_len);
            transaction.commit();
        };
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction              = queue.template start_reentrant_emplace<Msg>();
            transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
            transaction.commit();
        };
        //! [sp_heter_queue reentrant_put_transaction raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            if (
              auto transaction =
                queue.template try_start_reentrant_emplace<Msg>(progress_lock_free))
            {
                // if we fail to allocate the raw block, we don't commit the put transaction
                transaction.element().m_len = i_len;
                transaction.element().m_data =
                  transaction.try_raw_allocate(progress_lock_free, i_len, 1);
                if (transaction.element().m_data)
                {
                    memcpy(transaction.element().m_data, i_data, i_len);

                    assert(
                      !transaction
                         .empty()); // a put transaction is not empty if it's bound to an element being put
                    transaction.commit();
                    assert(transaction.empty()); // the commit makes the transaction empty
                }
            }
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction = queue.template try_start_reentrant_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_len = i_len;
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_data, i_data + i_len);
            if (transaction.element().m_chars)
            {
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            }
        };
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction = queue.template try_start_reentrant_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_string);
            if (transaction.element().m_chars)
            {
                transaction.commit();
            }
        };
        //! [sp_heter_queue reentrant_put_transaction try_raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue reentrant_put_transaction empty example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue                                                queue;
        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(transaction.empty());

        transaction = queue.start_reentrant_push(1);
        assert(!transaction.empty());
        //! [sp_heter_queue reentrant_put_transaction empty example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction operator_bool example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(!transaction);

        transaction = queue.start_reentrant_push(1);
        assert(transaction);
        //! [sp_heter_queue reentrant_put_transaction operator_bool example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction queue example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template reentrant_put_transaction<> transaction;
        assert(transaction.queue() == nullptr);

        transaction = queue.start_reentrant_push(1);
        assert(transaction.queue() == &queue);
        //! [sp_heter_queue reentrant_put_transaction queue example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction cancel example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        // start and cancel a put
        assert(queue.empty());
        auto put = queue.start_reentrant_push(42);
        /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
                the queue during a non-reentrant put transaction. */
        assert(!put.empty());
        put.cancel();
        assert(queue.empty() && put.empty());

        // start and commit a put
        put = queue.start_reentrant_push(42);
        put.commit();
        assert(queue.try_start_reentrant_consume().template element<int>() == 42);
        //! [sp_heter_queue reentrant_put_transaction cancel example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(*static_cast<int *>(put.element_ptr()) == 42);
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        put.commit();
        //! [sp_heter_queue reentrant_put_transaction element_ptr example 1]

        //! [sp_heter_queue reentrant_put_transaction element_ptr example 2]
        auto put_1 = queue.start_reentrant_push(1);
        assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
        assert(put_1.element() == 1);                          // this is better
        put_1.commit();
        //! [sp_heter_queue reentrant_put_transaction element_ptr example 2]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction complete_type example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(put.complete_type().template is<int>());
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        //! [sp_heter_queue reentrant_put_transaction complete_type example 1]
    }
    {
        //! [sp_heter_queue reentrant_put_transaction destroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        queue.start_reentrant_push(42); /* this transaction is destroyed without being committed,
                                    so it gets canceled automatically. */
        //! [sp_heter_queue reentrant_put_transaction destroy example 1]
    }
    {
        //! [sp_heter_queue reentrant_typed_put_transaction element example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto untyped_put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

        auto typed_put = queue.start_reentrant_push(42.);

        /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
                transaction to a typed transaction */

        assert(typed_put.element() == 42.);

        //! [sp_heter_queue reentrant_typed_put_transaction element example 1]
    }
}